

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlUTF8Strlen(xmlChar *utf)

{
  int local_1c;
  byte *pbStack_18;
  int ret;
  xmlChar *utf_local;
  
  local_1c = 0;
  pbStack_18 = utf;
  if (utf == (xmlChar *)0x0) {
    utf_local._4_4_ = -1;
  }
  else {
    while (*pbStack_18 != 0) {
      if ((*pbStack_18 & 0x80) == 0) {
        pbStack_18 = pbStack_18 + 1;
      }
      else {
        if ((pbStack_18[1] & 0xc0) != 0x80) {
          return -1;
        }
        if ((*pbStack_18 & 0xe0) == 0xe0) {
          if ((pbStack_18[2] & 0xc0) != 0x80) {
            return -1;
          }
          if ((*pbStack_18 & 0xf0) == 0xf0) {
            if (((*pbStack_18 & 0xf8) != 0xf0) || ((pbStack_18[3] & 0xc0) != 0x80)) {
              return -1;
            }
            pbStack_18 = pbStack_18 + 4;
          }
          else {
            pbStack_18 = pbStack_18 + 3;
          }
        }
        else {
          pbStack_18 = pbStack_18 + 2;
        }
      }
      local_1c = local_1c + 1;
    }
    utf_local._4_4_ = local_1c;
  }
  return utf_local._4_4_;
}

Assistant:

int
xmlUTF8Strlen(const xmlChar *utf) {
    int ret = 0;

    if (utf == NULL)
        return(-1);

    while (*utf != 0) {
        if (utf[0] & 0x80) {
            if ((utf[1] & 0xc0) != 0x80)
                return(-1);
            if ((utf[0] & 0xe0) == 0xe0) {
                if ((utf[2] & 0xc0) != 0x80)
                    return(-1);
                if ((utf[0] & 0xf0) == 0xf0) {
                    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
                        return(-1);
                    utf += 4;
                } else {
                    utf += 3;
                }
            } else {
                utf += 2;
            }
        } else {
            utf++;
        }
        ret++;
    }
    return(ret);
}